

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_comparable.c
# Opt level: O2

int comparable_callback_ptr(comparable a,comparable b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (b <= a) {
    uVar1 = (uint)(b < a);
  }
  return uVar1;
}

Assistant:

int comparable_callback_ptr(const comparable a, const comparable b)
{
	const void *void_ptr_a = a;
	const void *void_ptr_b = b;

	if (void_ptr_a < void_ptr_b)
	{
		return -1;
	}
	else if (void_ptr_a > void_ptr_b)
	{
		return 1;
	}
	else
	{
		return 0;
	}
}